

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

bool __thiscall
QSpanCollection::cleanSpanSubIndex(QSpanCollection *this,SubIndex *subindex,int y,bool update)

{
  int iVar1;
  long lVar2;
  Span *pSVar3;
  const_iterator it_00;
  const_iterator it_01;
  byte bVar4;
  bool bVar5;
  int *piVar6;
  Span **ppSVar7;
  byte in_CL;
  int in_EDX;
  QMap<int,_QSpanCollection::Span_*> *in_RSI;
  long in_FS_OFFSET;
  int x;
  bool should_be_deleted;
  Span *span;
  iterator it;
  iterator *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  QMap<int,_QSpanCollection::Span_*> *in_stack_ffffffffffffff78;
  QMap<int,_QSpanCollection::Span_*> *in_stack_ffffffffffffff80;
  undefined2 in_stack_ffffffffffffff98;
  byte bVar8;
  bool local_49;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = in_CL & 1;
  bVar5 = QMap<int,_QSpanCollection::Span_*>::isEmpty
                    ((QMap<int,_QSpanCollection::Span_*> *)
                     CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  if (bVar5) {
    local_49 = true;
  }
  else {
    bVar8 = 1;
    QMap<int,_QSpanCollection::Span_*>::end(in_stack_ffffffffffffff80);
    do {
      QMap<int,_QSpanCollection::Span_*>::iterator::operator--
                ((iterator *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
      piVar6 = QMap<int,_QSpanCollection::Span_*>::iterator::key((iterator *)0x8b108c);
      iVar1 = *piVar6;
      ppSVar7 = QMap<int,_QSpanCollection::Span_*>::iterator::value((iterator *)0x8b10a4);
      pSVar3 = *ppSVar7;
      if ((pSVar3->will_be_deleted & 1U) == 0) {
        if (((bVar4 & 1) != 0) && (pSVar3->m_left != -iVar1)) {
          QMap<int,_QSpanCollection::Span_*>::insert
                    (in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffff78,
                     (Span **)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
          in_stack_ffffffffffffff78 = in_RSI;
          QMap<int,_QSpanCollection::Span_*>::const_iterator::const_iterator
                    ((const_iterator *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                     ,in_stack_ffffffffffffff68);
          it_01.i._M_node._2_1_ = bVar8;
          it_01.i._M_node._0_2_ = in_stack_ffffffffffffff98;
          it_01.i._M_node._3_1_ = bVar4;
          it_01.i._M_node._4_4_ = in_EDX;
          QMap<int,_QSpanCollection::Span_*>::erase(in_stack_ffffffffffffff78,it_01);
        }
        if (((bVar8 & 1) != 0) && (pSVar3->m_top == in_EDX)) {
          bVar8 = 0;
        }
      }
      else {
        in_stack_ffffffffffffff80 = in_RSI;
        QMap<int,_QSpanCollection::Span_*>::const_iterator::const_iterator
                  ((const_iterator *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68);
        it_00.i._M_node._2_1_ = bVar8;
        it_00.i._M_node._0_2_ = in_stack_ffffffffffffff98;
        it_00.i._M_node._3_1_ = bVar4;
        it_00.i._M_node._4_4_ = in_EDX;
        QMap<int,_QSpanCollection::Span_*>::erase(in_stack_ffffffffffffff78,it_00);
      }
      QMap<int,_QSpanCollection::Span_*>::begin(in_stack_ffffffffffffff80);
      bVar5 = ::operator!=((iterator *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70)
                           ,in_stack_ffffffffffffff68);
    } while (bVar5);
    local_49 = (bool)(bVar8 & 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_49;
}

Assistant:

bool QSpanCollection::cleanSpanSubIndex(QSpanCollection::SubIndex &subindex, int y, bool update)
{
    if (subindex.isEmpty())
        return true;

    bool should_be_deleted = true;
    SubIndex::iterator it = subindex.end();
    do {
        --it;
        int x = -it.key();
        Span *span = it.value();
        if (span->will_be_deleted) {
            it = subindex.erase(it);
            continue;
        }
        if (update && span->m_left != x) {
            subindex.insert(-span->m_left, span);
            it = subindex.erase(it);
        }
        if (should_be_deleted && span->m_top == y)
            should_be_deleted = false;
    } while (it != subindex.begin());

    return should_be_deleted;
}